

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_meshb_geom_delete_me
          (REF_GEOM ref_geom,REF_INT ngeom,REF_INT type,REF_NODE ref_node,REF_INT nnode,FILE *file)

{
  int *piVar1;
  int iVar2;
  REF_DBL RVar3;
  REF_GEOM pRVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  REF_DBL *pRVar10;
  int *__ptr;
  undefined4 *puVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  REF_MPI ref_mpi;
  REF_INT dest;
  int iVar15;
  size_t __size;
  int iVar16;
  ulong uVar17;
  int iVar18;
  undefined4 in_register_00000084;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  REF_DBL *pRVar22;
  ulong uVar23;
  long lVar24;
  REF_STATUS RVar25;
  size_t sVar26;
  ulong uVar27;
  FILE *__stream;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  REF_INT node;
  double double_gref;
  REF_INT new_geom;
  REF_INT end_of_message;
  REF_INT local_fc;
  REF_DBL *local_f8;
  int local_f0;
  undefined4 uStack_ec;
  uint local_e4;
  void *local_e0;
  undefined4 *local_d8;
  int local_cc;
  REF_DBL *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  REF_MPI local_a0;
  void *local_98;
  ulong local_90;
  undefined4 *local_88;
  REF_DBL *local_80;
  FILE *local_78;
  void *local_70;
  REF_NODE local_68;
  REF_GEOM local_60;
  undefined4 local_54;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  ref_mpi = ref_node->ref_mpi;
  local_54 = 0xffffffff;
  uVar5 = ref_mpi->n;
  uVar7 = 1000000;
  if (1000000 < ngeom / (int)uVar5) {
    uVar7 = ngeom / (int)uVar5;
  }
  uVar20 = (ulong)uVar7;
  if (ngeom <= (int)uVar7) {
    uVar20 = (ulong)(uint)ngeom;
  }
  local_60 = ref_geom;
  if (ngeom < 0) {
    pcVar19 = "malloc sent_node of REF_INT negative";
    uVar14 = 0xbc;
LAB_00193d97:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
           "ref_part_meshb_geom_delete_me",pcVar19);
LAB_00193d9e:
    RVar25 = 1;
  }
  else {
    sVar26 = uVar20 << 2;
    local_78 = (FILE *)file;
    local_50 = CONCAT44(in_register_00000084,nnode);
    local_b8 = malloc(sVar26);
    if (local_b8 == (void *)0x0) {
      pcVar19 = "malloc sent_node of REF_INT NULL";
      uVar14 = 0xbc;
    }
    else {
      local_68 = ref_node;
      pvVar8 = malloc(sVar26);
      if (pvVar8 == (void *)0x0) {
        pcVar19 = "malloc sent_id of REF_INT NULL";
        uVar14 = 0xbd;
      }
      else {
        pvVar9 = malloc(sVar26);
        if (pvVar9 == (void *)0x0) {
          pcVar19 = "malloc sent_gref of REF_INT NULL";
          uVar14 = 0xbe;
        }
        else {
          __size = (ulong)(uint)((int)uVar20 * 2) << 3;
          local_e0 = pvVar9;
          local_c0 = pvVar8;
          pRVar10 = (REF_DBL *)malloc(__size);
          pRVar4 = local_60;
          local_c8 = pRVar10;
          if (pRVar10 == (REF_DBL *)0x0) {
            pcVar19 = "malloc sent_param of REF_DBL NULL";
            uVar14 = 0xbf;
          }
          else {
            local_a0 = ref_mpi;
            if (ref_mpi->id != 0) {
              do {
                uVar5 = ref_mpi_scatter_recv(ref_mpi,&local_f0,1,1);
                if (uVar5 != 0) {
                  pcVar19 = "recv";
                  uVar14 = 0x129;
                  goto LAB_0019493a;
                }
                pRVar22 = pRVar10;
                if (0 < local_f0) {
                  uVar5 = ref_mpi_scatter_recv(ref_mpi,local_b8,local_f0,1);
                  if (uVar5 != 0) {
                    pcVar19 = "send";
                    uVar14 = 0x12d;
                    goto LAB_0019493a;
                  }
                  uVar5 = ref_mpi_scatter_recv(ref_mpi,local_c0,local_f0,1);
                  if (uVar5 != 0) {
                    pcVar19 = "send";
                    uVar14 = 0x130;
                    goto LAB_0019493a;
                  }
                  uVar5 = ref_mpi_scatter_recv(ref_mpi,local_e0,local_f0,1);
                  if (uVar5 != 0) {
                    pcVar19 = "send";
                    uVar14 = 0x133;
                    goto LAB_0019493a;
                  }
                  uVar5 = ref_mpi_scatter_recv(ref_mpi,pRVar10,local_f0 * 2,3);
                  if (uVar5 != 0) {
                    pcVar19 = "send";
                    uVar14 = 0x136;
                    goto LAB_0019493a;
                  }
                  if (0 < local_f0) {
                    lVar21 = 0;
                    do {
                      uVar5 = ref_node_local(local_68,(long)*(int *)((long)local_b8 + lVar21 * 4),
                                             &local_fc);
                      pvVar8 = local_c0;
                      if (uVar5 != 0) {
                        pcVar19 = "g2l";
                        uVar14 = 0x138;
                        goto LAB_0019493a;
                      }
                      uVar5 = ref_geom_add(pRVar4,local_fc,type,
                                           *(REF_INT *)((long)local_c0 + lVar21 * 4),pRVar10);
                      if (uVar5 != 0) {
                        pcVar19 = "add geom";
                        uVar14 = 0x13b;
                        goto LAB_0019493a;
                      }
                      uVar5 = ref_geom_find(pRVar4,local_fc,type,
                                            *(REF_INT *)((long)pvVar8 + lVar21 * 4),&local_cc);
                      if (uVar5 != 0) {
                        pcVar19 = "find";
                        uVar14 = 0x13d;
                        goto LAB_0019493a;
                      }
                      pRVar4->descr[(long)local_cc * 6 + 2] =
                           *(REF_INT *)((long)local_e0 + lVar21 * 4);
                      lVar21 = lVar21 + 1;
                      pRVar10 = pRVar10 + 2;
                      ref_mpi = local_a0;
                      pRVar22 = local_c8;
                    } while (lVar21 < local_f0);
                  }
                }
                pRVar10 = pRVar22;
              } while (local_f0 != -1);
LAB_00193d48:
              free(pRVar22);
              free(local_e0);
              free(local_c0);
              free(local_b8);
              return 0;
            }
            if ((int)uVar5 < 0) {
              pcVar19 = "malloc geom_to_send of REF_INT negative";
              uVar14 = 0xc2;
              goto LAB_00193d97;
            }
            local_d8 = (undefined4 *)((ulong)uVar5 * 4);
            __ptr = (int *)malloc((size_t)local_d8);
            if (__ptr == (int *)0x0) {
              pcVar19 = "malloc geom_to_send of REF_INT NULL";
              uVar14 = 0xc2;
            }
            else {
              puVar11 = (undefined4 *)malloc((size_t)local_d8);
              if (puVar11 == (undefined4 *)0x0) {
                pcVar19 = "malloc start_to_send of REF_INT NULL";
                uVar14 = 0xc3;
              }
              else {
                local_d8 = puVar11;
                pvVar8 = malloc(sVar26);
                if (pvVar8 == (void *)0x0) {
                  pcVar19 = "malloc read_node of REF_INT NULL";
                  uVar14 = 0xc4;
                }
                else {
                  local_b0 = pvVar8;
                  pvVar8 = malloc(sVar26);
                  if (pvVar8 == (void *)0x0) {
                    pcVar19 = "malloc read_id of REF_INT NULL";
                    uVar14 = 0xc5;
                  }
                  else {
                    local_70 = pvVar8;
                    pvVar8 = malloc(sVar26);
                    if (pvVar8 == (void *)0x0) {
                      pcVar19 = "malloc read_gref of REF_INT NULL";
                      uVar14 = 0xc6;
                    }
                    else {
                      local_a8 = pvVar8;
                      pRVar10 = (REF_DBL *)malloc(__size);
                      if (pRVar10 == (REF_DBL *)0x0) {
                        pcVar19 = "malloc read_param of REF_DBL NULL";
                        uVar14 = 199;
                      }
                      else {
                        local_80 = pRVar10;
                        pvVar8 = malloc(sVar26);
                        if (pvVar8 != (void *)0x0) {
                          if (ngeom != 0) {
                            local_48 = (ulong)((int)local_50 - 1);
                            local_38 = (ulong)(uint)type;
                            uVar23 = 0;
                            auVar34 = _DAT_00211220;
                            local_98 = pvVar8;
                            do {
                              uVar5 = ngeom - (int)uVar23;
                              uVar17 = (ulong)uVar5;
                              if ((int)uVar20 < (int)uVar5) {
                                uVar17 = uVar20;
                              }
                              iVar15 = (int)uVar17;
                              local_40 = uVar23;
                              if ((int)uVar5 < 1) {
LAB_001941ce:
                                uVar7 = ref_mpi->n;
                              }
                              else {
                                local_90 = 1;
                                if (1 < iVar15) {
                                  local_90 = uVar17;
                                }
                                local_f8 = local_80;
                                uVar23 = 0;
                                __stream = local_78;
                                local_e4 = uVar5;
                                do {
                                  sVar26 = fread((void *)((long)local_b0 + uVar23 * 4),4,1,__stream)
                                  ;
                                  if (sVar26 != 1) {
                                    pcVar19 = "n";
                                    uVar14 = 0xce;
LAB_00194a99:
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,uVar14,"ref_part_meshb_geom_delete_me",pcVar19,1,sVar26)
                                    ;
                                    goto LAB_00193d9e;
                                  }
                                  local_88 = (undefined4 *)((long)local_70 + uVar23 * 4);
                                  sVar26 = fread(local_88,4,1,__stream);
                                  if (sVar26 != 1) {
                                    pcVar19 = "n";
                                    uVar14 = 0xcf;
                                    goto LAB_00194a99;
                                  }
                                  *(undefined1 (*) [16])(local_80 + uVar23 * 2) =
                                       (undefined1  [16])0x0;
                                  pRVar10 = local_f8;
                                  uVar27 = local_38;
                                  if (type < 1) {
                                    *(undefined4 *)((long)local_a8 + uVar23 * 4) = *local_88;
                                    uVar13 = local_90;
                                    __stream = local_78;
                                  }
                                  else {
                                    do {
                                      sVar26 = fread(pRVar10,8,1,local_78);
                                      __stream = local_78;
                                      uVar13 = local_90;
                                      if (sVar26 != 1) {
                                        pcVar19 = "param";
                                        uVar14 = 0xd4;
                                        goto LAB_00194a99;
                                      }
                                      pRVar10 = pRVar10 + 1;
                                      uVar27 = uVar27 - 1;
                                    } while (uVar27 != 0);
                                    *(undefined4 *)((long)local_a8 + uVar23 * 4) = *local_88;
                                    if (0 < type) {
                                      sVar26 = fread(&local_f0,8,1,local_78);
                                      if (sVar26 != 1) {
                                        pcVar19 = "gref";
                                        uVar14 = 0xd7;
                                        goto LAB_00194a99;
                                      }
                                      *(int *)((long)local_a8 + uVar23 * 4) =
                                           (int)(double)CONCAT44(uStack_ec,local_f0);
                                    }
                                  }
                                  uVar23 = uVar23 + 1;
                                  local_f8 = local_f8 + 2;
                                } while (uVar23 != uVar13);
                                auVar34 = _DAT_00211220;
                                uVar5 = local_e4;
                                if ((int)local_e4 < 1) goto LAB_001941ce;
                                uVar23 = 0;
                                do {
                                  piVar1 = (int *)((long)local_b0 + uVar23 * 4);
                                  *piVar1 = *piVar1 + -1;
                                  uVar23 = uVar23 + 1;
                                } while (local_90 != uVar23);
                                uVar7 = local_a0->n;
                                ref_mpi = local_a0;
                                auVar34 = _DAT_00211220;
                                if (0 < (int)local_e4) {
                                  iVar12 = (int)((int)local_48 + uVar7) / (int)uVar7;
                                  iVar16 = (int)((long)((ulong)(uint)((int)local_48 >> 0x1f) << 0x20
                                                       | local_48 & 0xffffffff) / (long)(int)uVar7);
                                  iVar18 = (int)local_50 - iVar16 * uVar7;
                                  uVar23 = 0;
                                  do {
                                    iVar2 = *(int *)((long)local_b0 + uVar23 * 4);
                                    iVar6 = iVar2 / iVar12;
                                    if (iVar18 <= iVar6) {
                                      iVar6 = (iVar2 - iVar12 * iVar18) / iVar16 + iVar18;
                                    }
                                    *(int *)((long)local_98 + uVar23 * 4) = iVar6;
                                    uVar23 = uVar23 + 1;
                                    auVar34 = _DAT_00211220;
                                  } while (local_90 != uVar23);
                                }
                              }
                              uVar23 = (ulong)uVar7;
                              if (0 < (int)uVar7) {
                                lVar21 = uVar23 - 1;
                                auVar28._8_4_ = (int)lVar21;
                                auVar28._0_8_ = lVar21;
                                auVar28._12_4_ = (int)((ulong)lVar21 >> 0x20);
                                auVar28 = auVar28 ^ auVar34;
                                lVar21 = 0;
                                auVar32 = _DAT_00211210;
                                auVar33 = _DAT_00214ce0;
                                do {
                                  auVar31 = auVar32 ^ auVar34;
                                  iVar16 = auVar28._4_4_;
                                  if ((bool)(~(auVar31._4_4_ == iVar16 &&
                                               auVar28._0_4_ < auVar31._0_4_ ||
                                              iVar16 < auVar31._4_4_) & 1)) {
                                    *(undefined4 *)((long)__ptr + lVar21) = 0;
                                  }
                                  if ((auVar31._12_4_ != auVar28._12_4_ ||
                                      auVar31._8_4_ <= auVar28._8_4_) &&
                                      auVar31._12_4_ <= auVar28._12_4_) {
                                    *(undefined4 *)((long)__ptr + lVar21 + 4) = 0;
                                  }
                                  iVar12 = SUB164(auVar33 ^ auVar34,4);
                                  if (iVar12 <= iVar16 &&
                                      (iVar12 != iVar16 ||
                                      SUB164(auVar33 ^ auVar34,0) <= auVar28._0_4_)) {
                                    *(undefined4 *)((long)__ptr + lVar21 + 8) = 0;
                                    *(undefined4 *)((long)__ptr + lVar21 + 0xc) = 0;
                                  }
                                  lVar24 = auVar32._8_8_;
                                  auVar32._0_8_ = auVar32._0_8_ + 4;
                                  auVar32._8_8_ = lVar24 + 4;
                                  lVar24 = auVar33._8_8_;
                                  auVar33._0_8_ = auVar33._0_8_ + 4;
                                  auVar33._8_8_ = lVar24 + 4;
                                  lVar21 = lVar21 + 0x10;
                                } while ((ulong)(uVar7 + 3 >> 2) << 4 != lVar21);
                              }
                              if (0 < (int)uVar5) {
                                uVar27 = 1;
                                if (1 < iVar15) {
                                  uVar27 = uVar17;
                                }
                                uVar13 = 0;
                                do {
                                  __ptr[*(int *)((long)local_98 + uVar13 * 4)] =
                                       __ptr[*(int *)((long)local_98 + uVar13 * 4)] + 1;
                                  uVar13 = uVar13 + 1;
                                } while (uVar27 != uVar13);
                              }
                              *local_d8 = 0;
                              if (1 < (int)uVar7) {
                                lVar21 = 0;
                                iVar16 = 0;
                                do {
                                  iVar16 = iVar16 + __ptr[lVar21];
                                  local_d8[lVar21 + 1] = iVar16;
                                  lVar21 = lVar21 + 1;
                                } while (uVar23 - 1 != lVar21);
                              }
                              if (0 < (int)uVar7) {
                                lVar21 = uVar23 - 1;
                                auVar29._8_4_ = (int)lVar21;
                                auVar29._0_8_ = lVar21;
                                auVar29._12_4_ = (int)((ulong)lVar21 >> 0x20);
                                lVar21 = 0;
                                auVar31 = _DAT_00211210;
                                auVar30 = _DAT_00214ce0;
                                do {
                                  auVar32 = auVar29 ^ auVar34;
                                  auVar33 = auVar31 ^ auVar34;
                                  iVar16 = auVar32._4_4_;
                                  if ((bool)(~(iVar16 < auVar33._4_4_ ||
                                              auVar32._0_4_ < auVar33._0_4_ &&
                                              auVar33._4_4_ == iVar16) & 1)) {
                                    *(undefined4 *)((long)__ptr + lVar21) = 0;
                                  }
                                  if (auVar33._12_4_ <= auVar32._12_4_ &&
                                      (auVar33._8_4_ <= auVar32._8_4_ ||
                                      auVar33._12_4_ != auVar32._12_4_)) {
                                    *(undefined4 *)((long)__ptr + lVar21 + 4) = 0;
                                  }
                                  iVar12 = SUB164(auVar30 ^ auVar34,4);
                                  if (iVar12 <= iVar16 &&
                                      (iVar12 != iVar16 ||
                                      SUB164(auVar30 ^ auVar34,0) <= auVar32._0_4_)) {
                                    *(undefined4 *)((long)__ptr + lVar21 + 8) = 0;
                                    *(undefined4 *)((long)__ptr + lVar21 + 0xc) = 0;
                                  }
                                  lVar24 = auVar31._8_8_;
                                  auVar31._0_8_ = auVar31._0_8_ + 4;
                                  auVar31._8_8_ = lVar24 + 4;
                                  lVar24 = auVar30._8_8_;
                                  auVar30._0_8_ = auVar30._0_8_ + 4;
                                  auVar30._8_8_ = lVar24 + 4;
                                  lVar21 = lVar21 + 0x10;
                                } while ((ulong)(uVar7 + 3 >> 2) << 4 != lVar21);
                              }
                              if (0 < (int)uVar5) {
                                uVar27 = 1;
                                if (1 < iVar15) {
                                  uVar27 = uVar17;
                                }
                                local_f8 = (REF_DBL *)(uVar27 << 2);
                                pRVar10 = (REF_DBL *)0x0;
                                do {
                                  iVar16 = *(int *)((long)local_98 + (long)pRVar10);
                                  iVar12 = __ptr[iVar16];
                                  __ptr[iVar16] = iVar12 + 1;
                                  lVar21 = (long)(int)local_d8[iVar16] + (long)iVar12;
                                  *(undefined4 *)((long)local_b8 + lVar21 * 4) =
                                       *(undefined4 *)((long)local_b0 + (long)pRVar10);
                                  *(undefined4 *)((long)local_c0 + lVar21 * 4) =
                                       *(undefined4 *)((long)local_70 + (long)pRVar10);
                                  *(undefined4 *)((long)local_e0 + lVar21 * 4) =
                                       *(undefined4 *)((long)local_a8 + (long)pRVar10);
                                  pRVar22 = (REF_DBL *)((long)local_80 + (long)pRVar10 * 4);
                                  RVar3 = pRVar22[1];
                                  local_c8[(int)lVar21 * 2] = *pRVar22;
                                  (local_c8 + (int)lVar21 * 2)[1] = RVar3;
                                  pRVar10 = (REF_DBL *)((long)pRVar10 + 4);
                                } while (local_f8 != pRVar10);
                              }
                              local_88 = (undefined4 *)(long)*__ptr;
                              if (0 < (long)local_88) {
                                local_f8 = local_c8;
                                puVar11 = (undefined4 *)0x0;
                                do {
                                  uVar5 = ref_node_local(local_68,(long)*(int *)((long)local_b8 +
                                                                                (long)puVar11 * 4),
                                                         &local_fc);
                                  pvVar8 = local_c0;
                                  if (uVar5 != 0) {
                                    pcVar19 = "g2l";
                                    uVar14 = 0xf9;
                                    goto LAB_0019493a;
                                  }
                                  uVar5 = ref_geom_add(local_60,local_fc,type,
                                                       *(REF_INT *)
                                                        ((long)local_c0 + (long)puVar11 * 4),
                                                       local_f8);
                                  pRVar4 = local_60;
                                  if (uVar5 != 0) {
                                    pcVar19 = "add geom";
                                    uVar14 = 0xfc;
                                    goto LAB_0019493a;
                                  }
                                  uVar5 = ref_geom_find(local_60,local_fc,type,
                                                        *(REF_INT *)
                                                         ((long)pvVar8 + (long)puVar11 * 4),
                                                        &local_cc);
                                  if (uVar5 != 0) {
                                    pcVar19 = "find";
                                    uVar14 = 0xfe;
                                    goto LAB_0019493a;
                                  }
                                  pRVar4->descr[(long)local_cc * 6 + 2] =
                                       *(REF_INT *)((long)local_e0 + (long)puVar11 * 4);
                                  puVar11 = (undefined4 *)((long)puVar11 + 1);
                                  local_f8 = local_f8 + 2;
                                } while (local_88 != puVar11);
                                uVar23 = (ulong)(uint)local_a0->n;
                                ref_mpi = local_a0;
                                auVar34 = _DAT_00211220;
                              }
                              uVar5 = (uint)uVar23;
                              if (1 < (int)uVar5) {
                                lVar21 = 1;
                                pRVar10 = (REF_DBL *)0x4;
                                do {
                                  if (0 < __ptr[lVar21]) {
                                    dest = (REF_INT)lVar21;
                                    local_f8 = pRVar10;
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)__ptr + (long)pRVar10)
                                                       ,1,1,dest);
                                    if (uVar5 != 0) {
                                      pcVar19 = "send";
                                      uVar14 = 0x107;
                                      goto LAB_0019493a;
                                    }
                                    iVar16 = local_d8[lVar21];
                                    lVar24 = (long)iVar16;
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_b8 + lVar24 * 4)
                                                       ,__ptr[lVar21],1,dest);
                                    if (uVar5 != 0) {
                                      pcVar19 = "send";
                                      uVar14 = 0x10a;
                                      goto LAB_0019493a;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_c0 + lVar24 * 4)
                                                       ,__ptr[lVar21],1,dest);
                                    if (uVar5 != 0) {
                                      pcVar19 = "send";
                                      uVar14 = 0x10d;
                                      goto LAB_0019493a;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_e0 + lVar24 * 4)
                                                       ,__ptr[lVar21],1,dest);
                                    if (uVar5 != 0) {
                                      pcVar19 = "send";
                                      uVar14 = 0x110;
                                      goto LAB_0019493a;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,local_c8 + iVar16 * 2,
                                                       __ptr[lVar21] * 2,3,dest);
                                    if (uVar5 != 0) {
                                      pcVar19 = "send";
                                      uVar14 = 0x114;
                                      goto LAB_0019493a;
                                    }
                                    uVar23 = (ulong)(uint)ref_mpi->n;
                                    pRVar10 = local_f8;
                                    auVar34 = _DAT_00211220;
                                  }
                                  lVar21 = lVar21 + 1;
                                  uVar5 = (uint)uVar23;
                                  pRVar10 = (REF_DBL *)((long)pRVar10 + 4);
                                } while (lVar21 < (int)uVar5);
                              }
                              uVar7 = (int)local_40 + iVar15;
                              uVar23 = (ulong)uVar7;
                              pvVar8 = local_98;
                            } while ((int)uVar7 < ngeom);
                          }
                          free(pvVar8);
                          free(local_80);
                          free(local_a8);
                          free(local_70);
                          free(local_b0);
                          free(local_d8);
                          free(__ptr);
                          pRVar22 = local_c8;
                          if (1 < (int)uVar5) {
                            iVar15 = 1;
                            do {
                              uVar5 = ref_mpi_scatter_send(ref_mpi,&local_54,1,1,iVar15);
                              if (uVar5 != 0) {
                                pcVar19 = "send";
                                uVar14 = 0x124;
LAB_0019493a:
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,uVar14,"ref_part_meshb_geom_delete_me",(ulong)uVar5,pcVar19)
                                ;
                                return uVar5;
                              }
                              iVar15 = iVar15 + 1;
                            } while (iVar15 < ref_mpi->n);
                          }
                          goto LAB_00193d48;
                        }
                        pcVar19 = "malloc dest of REF_INT NULL";
                        uVar14 = 200;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
           "ref_part_meshb_geom_delete_me",pcVar19);
    RVar25 = 2;
  }
  return RVar25;
}

Assistant:

REF_FCN REF_STATUS ref_part_meshb_geom_delete_me(REF_GEOM ref_geom,
                                                 REF_INT ngeom, REF_INT type,
                                                 REF_NODE ref_node,
                                                 REF_INT nnode, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT end_of_message = REF_EMPTY;
  REF_INT chunk;
  REF_INT *sent_node;
  REF_INT *sent_id;
  REF_INT *sent_gref;
  REF_DBL *sent_param;
  REF_INT *read_node;
  REF_INT *read_id;
  REF_INT *read_gref;
  REF_DBL *read_param;
  double double_gref;

  REF_INT ngeom_read, ngeom_keep;
  REF_INT section_size;

  REF_INT *dest;
  REF_INT *geom_to_send;
  REF_INT *start_to_send;

  REF_INT geom_to_receive;

  REF_INT geom, i, new_geom;
  REF_INT part, node;
  REF_INT new_location;

  chunk = MAX(1000000, ngeom / ref_mpi_n(ref_mpi));
  chunk = MIN(chunk, ngeom);

  ref_malloc(sent_node, chunk, REF_INT);
  ref_malloc(sent_id, chunk, REF_INT);
  ref_malloc(sent_gref, chunk, REF_INT);
  ref_malloc(sent_param, 2 * chunk, REF_DBL);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(geom_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(read_node, chunk, REF_INT);
    ref_malloc(read_id, chunk, REF_INT);
    ref_malloc(read_gref, chunk, REF_INT);
    ref_malloc(read_param, 2 * chunk, REF_DBL);
    ref_malloc(dest, chunk, REF_INT);

    ngeom_read = 0;
    while (ngeom_read < ngeom) {
      section_size = MIN(chunk, ngeom - ngeom_read);
      for (geom = 0; geom < section_size; geom++) {
        REIS(1, fread(&(read_node[geom]), sizeof(REF_INT), 1, file), "n");
        REIS(1, fread(&(read_id[geom]), sizeof(REF_INT), 1, file), "n");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_INT)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;

      ngeom_read += section_size;

      for (geom = 0; geom < section_size; geom++)
        dest[geom] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), read_node[geom]);

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) geom_to_send[dest[geom]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] = start_to_send[part - 1] + geom_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) {
        new_location = start_to_send[dest[geom]] + geom_to_send[dest[geom]];
        sent_node[new_location] = read_node[geom];
        sent_id[new_location] = read_id[geom];
        sent_gref[new_location] = read_gref[geom];
        sent_param[0 + 2 * new_location] = read_param[0 + 2 * geom];
        sent_param[1 + 2 * new_location] = read_param[1 + 2 * geom];
        geom_to_send[dest[geom]]++;
      }

      /* rank 0 keepers */
      ngeom_keep = geom_to_send[0];
      for (geom = 0; geom < ngeom_keep; geom++) {
        RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
        RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                         &(sent_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
      }

      /* ship it! */
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < geom_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(geom_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_node[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_id[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_gref[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi,
                                   &(sent_param[2 * start_to_send[part]]),
                                   2 * geom_to_send[part], REF_DBL_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(read_param);
    ref_free(read_gref);
    ref_free(read_id);
    ref_free(read_node);
    ref_free(start_to_send);
    ref_free(geom_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &geom_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (geom_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_node, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_id, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_gref, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_param, 2 * geom_to_receive,
                                 REF_DBL_TYPE),
            "send");
        for (geom = 0; geom < geom_to_receive; geom++) {
          RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
          RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                           &(sent_param[2 * geom])),
              "add geom");
          RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
              "find");
          ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
        }
      }
    } while (geom_to_receive != end_of_message);
  }

  free(sent_param);
  free(sent_gref);
  free(sent_id);
  free(sent_node);

  return REF_SUCCESS;
}